

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::CheckDoubleMaximum
          (Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
           *this,Context *context,double d)

{
  bool bVar1;
  ValueType *this_00;
  Ch *pCVar2;
  ValidateErrorCode validateErrorCode;
  double dVar3;
  
  bVar1 = this->exclusiveMaximum_;
  dVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetDouble(&this->maximum_);
  if (bVar1 == true) {
    if (d < dVar3) {
      return true;
    }
  }
  else if (d <= dVar3) {
    return true;
  }
  (*context->error_handler->_vptr_IValidationErrorHandler[7])
            (d,context->error_handler,&this->maximum_,(ulong)this->exclusiveMaximum_);
  validateErrorCode = (uint)this->exclusiveMaximum_ | kValidateErrorMaximum;
  context->invalidCode = validateErrorCode;
  this_00 = GetValidateErrorKeyword(validateErrorCode);
  pCVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(this_00);
  context->invalidKeyword = pCVar2;
  return false;
}

Assistant:

bool CheckDoubleMaximum(Context& context, double d) const {
        if (exclusiveMaximum_ ? d >= maximum_.GetDouble() : d > maximum_.GetDouble()) {
            context.error_handler.AboveMaximum(d, maximum_, exclusiveMaximum_);
            RAPIDJSON_INVALID_KEYWORD_RETURN(exclusiveMaximum_ ? kValidateErrorExclusiveMaximum : kValidateErrorMaximum);
        }
        return true;
    }